

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

bool mightBeRichTextImpl<QLatin1String>(QLatin1String text)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  CutResult CVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  char *pcVar8;
  char *pcVar9;
  qsizetype qVar10;
  wchar32 wVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QStringView element;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QStringView QVar20;
  char16_t local_25a;
  qsizetype local_258;
  QVLABase<char16_t> local_250;
  storage_type_conflict local_238 [256];
  long local_38;
  
  pcVar8 = text.m_data;
  lVar6 = text.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lVar6 != 0) {
    if (lVar6 < 1) {
      lVar13 = 0;
    }
    else {
      lVar12 = 0;
      do {
        bVar2 = pcVar8[lVar12];
        if (((4 < bVar2 - 9) && (bVar2 != 0x20)) &&
           ((lVar13 = lVar12, -1 < (char)bVar2 ||
            (((bVar2 != 0x85 && ((uint)bVar2 != L'\xa0')) &&
             (cVar3 = QChar::isSpace_helper((uint)bVar2), cVar3 == '\0')))))) break;
        lVar12 = lVar12 + 1;
        lVar13 = lVar6;
      } while (lVar6 != lVar12);
    }
    local_258 = 5;
    local_250.super_QVLABaseBase.a = lVar13;
    CVar4 = QtPrivate::QContainerImplHelper::mid(lVar6,(qsizetype *)&local_250,&local_258);
    if (CVar4 == Null) {
      qVar10 = 0;
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = pcVar8 + local_250.super_QVLABaseBase.a;
      qVar10 = local_258;
    }
    QVar14.m_data = pcVar9;
    QVar14.m_size = qVar10;
    QVar17.m_data = "<?xml";
    QVar17.m_size = 5;
    iVar5 = QtPrivate::compareStrings(QVar14,QVar17,CaseSensitive);
    lVar12 = lVar13;
    if (iVar5 == 0) {
      if (lVar13 < lVar6) {
        lVar13 = lVar13 + 2;
        do {
          if (((pcVar8[lVar13 + -2] == '?') && (lVar13 < lVar6)) && (pcVar8[lVar13 + -1] == '>'))
          goto LAB_004cc20c;
          lVar1 = lVar13 - lVar6;
          lVar13 = lVar13 + 1;
          lVar12 = lVar6;
        } while (lVar1 != 1);
      }
      else {
LAB_004cc20c:
        lVar12 = lVar13;
        if (lVar13 < lVar6) {
          do {
            bVar2 = pcVar8[lVar13];
            if (((4 < bVar2 - 9) && (bVar2 != 0x20)) &&
               ((lVar12 = lVar13, -1 < (char)bVar2 ||
                (((bVar2 != 0x85 && ((uint)bVar2 != L'\xa0')) &&
                 (cVar3 = QChar::isSpace_helper((uint)bVar2), cVar3 == '\0')))))) break;
            lVar13 = lVar13 + 1;
            lVar12 = lVar6;
          } while (lVar6 != lVar13);
        }
      }
    }
    local_258 = 5;
    local_250.super_QVLABaseBase.a = lVar12;
    CVar4 = QtPrivate::QContainerImplHelper::mid(lVar6,(qsizetype *)&local_250,&local_258);
    qVar10 = 0;
    if (CVar4 == Null) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = pcVar8 + local_250.super_QVLABaseBase.a;
      qVar10 = local_258;
    }
    QVar15.m_data = pcVar9;
    QVar15.m_size = qVar10;
    QVar18.m_data = "<!doc";
    QVar18.m_size = 5;
    iVar5 = QtPrivate::compareStrings(QVar15,QVar18,CaseInsensitive);
    bVar7 = true;
    if (iVar5 == 0) goto LAB_004cc31d;
    if (lVar12 < lVar6) {
      do {
        cVar3 = pcVar8[lVar12];
        if (cVar3 == '&') {
          local_250.super_QVLABaseBase.a = lVar12 + 1;
          local_258 = 3;
          CVar4 = QtPrivate::QContainerImplHelper::mid(lVar6,(qsizetype *)&local_250,&local_258);
          if (((CVar4 != Null) && (local_258 == 3)) &&
             (QVar16.m_data = pcVar8 + local_250.super_QVLABaseBase.a, QVar16.m_size = 3,
             QVar19.m_data = "lt;", QVar19.m_size = 3,
             cVar3 = QtPrivate::equalStrings(QVar16,QVar19), cVar3 != '\0')) goto LAB_004cc31d;
        }
        else {
          if (cVar3 == '\n') break;
          if (cVar3 == '<') {
            local_250.super_QVLABaseBase.a = CONCAT62(local_250.super_QVLABaseBase.a._2_6_,0x3e);
            QVar20.m_data = (storage_type_conflict *)&local_250;
            QVar20.m_size = 1;
            lVar6 = QtPrivate::findString(text,lVar12,QVar20,CaseSensitive);
            if (-1 < lVar6) {
              memset(local_238,0xaa,0x200);
              local_250.super_QVLABaseBase.a = 0x100;
              local_250.super_QVLABaseBase.s = 0;
              lVar12 = lVar12 + 1;
              local_250.super_QVLABaseBase.ptr = local_238;
              if (lVar6 <= lVar12) {
                qVar10 = 0;
                goto LAB_004cc52e;
              }
              goto LAB_004cc3ad;
            }
            break;
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar6);
    }
  }
  bVar7 = false;
  goto LAB_004cc31d;
LAB_004cc3ad:
  do {
    bVar2 = pcVar8[lVar12];
    if (bVar2 - 0x30 < 10) {
LAB_004cc465:
      local_25a = QChar::toLower((uint)bVar2);
      if (local_250.super_QVLABaseBase.s == local_250.super_QVLABaseBase.a) {
        local_258 = CONCAT62(local_258._2_6_,local_25a);
        QVLABase<char16_t>::emplace_back_impl<char16_t>
                  (&local_250,0x100,local_238,(char16_t *)&local_258);
      }
      else {
        QVLABase<char16_t>::emplace_back_impl<char16_t_const&>
                  (&local_250,0x100,local_238,&local_25a);
      }
    }
    else {
      if ((char)bVar2 < '\0') {
        iVar5 = QChar::category((uint)bVar2);
        if (((iVar5 == 3) || (bVar2 - 0x41 < 0x3a && bVar2 - 0x61 < 0xfffffffa)) ||
           (cVar3 = QChar::isLetter_helper((uint)bVar2), cVar3 != '\0')) goto LAB_004cc465;
      }
      else if (bVar2 - 0x41 < 0x3a && bVar2 - 0x61 < 0xfffffffa) goto LAB_004cc465;
      qVar10 = local_250.super_QVLABaseBase.s;
      wVar11 = (wchar32)bVar2;
      if (local_250.super_QVLABaseBase.s != 0) {
        if ((0x20 < bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          if ((char)bVar2 < '\0') {
            if (((bVar2 != 0x85) && (bVar2 != 0xa0)) &&
               (cVar3 = QChar::isSpace_helper((uint)bVar2), cVar3 == '\0')) goto LAB_004cc4e3;
          }
          else {
            if ((bVar2 - 9 < 5) || (bVar2 == 0x20)) goto LAB_004cc4b7;
            if ((wVar11 != L'/') || (lVar12 - lVar6 != -1)) {
LAB_004cc576:
              bVar7 = false;
              goto LAB_004cc542;
            }
          }
        }
        break;
      }
LAB_004cc4e3:
      if ((4 < bVar2 - 9) && (wVar11 != L' ')) {
        if ((char)bVar2 < '\0') {
          if (((bVar2 != 0x85) && (bVar2 != 0xa0)) &&
             (cVar3 = QChar::isSpace_helper(wVar11), cVar3 == '\0')) goto LAB_004cc576;
        }
        else {
          bVar7 = false;
          if ((wVar11 != L'!') || (bVar7 = false, qVar10 != 0)) goto LAB_004cc542;
        }
      }
    }
LAB_004cc4b7:
    lVar12 = lVar12 + 1;
    qVar10 = local_250.super_QVLABaseBase.s;
  } while (lVar12 < lVar6);
LAB_004cc52e:
  element.m_data = (storage_type_conflict *)local_250.super_QVLABaseBase.ptr;
  element.m_size = qVar10;
  iVar5 = QTextHtmlParser::lookupElement(element);
  bVar7 = iVar5 != -1;
LAB_004cc542:
  if ((storage_type_conflict *)local_250.super_QVLABaseBase.ptr != local_238) {
    QtPrivate::sizedFree(local_250.super_QVLABaseBase.ptr,local_250.super_QVLABaseBase.a * 2);
  }
LAB_004cc31d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

static bool mightBeRichTextImpl(T text)
{
    if (text.isEmpty())
        return false;
    qsizetype start = 0;

    while (start < text.size() && QChar(text.at(start)).isSpace())
        ++start;

    // skip a leading <?xml ... ?> as for example with xhtml
    if (text.mid(start, 5).compare("<?xml"_L1) == 0) {
        while (start < text.size()) {
            if (text.at(start) == u'?'
                && start + 2 < text.size()
                && text.at(start + 1) == u'>') {
                start += 2;
                break;
            }
            ++start;
        }

        while (start < text.size() && QChar(text.at(start)).isSpace())
            ++start;
    }

    if (text.mid(start, 5).compare("<!doc"_L1, Qt::CaseInsensitive) == 0)
        return true;
    qsizetype open = start;
    while (open < text.size() && text.at(open) != u'<'
            && text.at(open) != u'\n') {
        if (text.at(open) == u'&' && text.mid(open + 1, 3) == "lt;"_L1)
            return true; // support desperate attempt of user to see <...>
        ++open;
    }
    if (open < text.size() && text.at(open) == u'<') {
        const qsizetype close = text.indexOf(u'>', open);
        if (close > -1) {
            QVarLengthArray<char16_t> tag;
            for (qsizetype i = open + 1; i < close; ++i) {
                const auto current = QChar(text[i]);
                if (current.isDigit() || current.isLetter())
                    tag.append(current.toLower().unicode());
                else if (!tag.isEmpty() && current.isSpace())
                    break;
                else if (!tag.isEmpty() && current == u'/' && i + 1 == close)
                    break;
                else if (!current.isSpace() && (!tag.isEmpty() || current != u'!'))
                    return false; // that's not a tag
            }
#ifndef QT_NO_TEXTHTMLPARSER
            return QTextHtmlParser::lookupElement(tag) != -1;
#else
            return false;
#endif // QT_NO_TEXTHTMLPARSER
        }
    }
    return false;
}